

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Vec_Int_t * Pdr_InvMinimize(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose)

{
  uint nSize;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  abctime aVar9;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  uint *puVar10;
  Vec_Int_t *p_01;
  Vec_Bit_t *p_02;
  int *piVar11;
  int *piVar12;
  abctime aVar13;
  int iAuxVarBeg;
  int iFiVarBeg;
  int iFoVarBeg;
  Vec_Bit_t *vRemoved;
  Vec_Int_t *vLits;
  int nCubes;
  int *pList;
  int *pCube;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Vec_Int_t *vRes;
  int nRemoved;
  int fCannot;
  int fFailed;
  int nLits;
  int status;
  int k;
  int i;
  int n;
  abctime clk;
  int fCheckProperty;
  int nBTLimit;
  int fVerbose_local;
  Vec_Int_t *vInv_local;
  Gia_Man_t *p_local;
  
  aVar9 = Abc_Clock();
  bVar1 = false;
  vRes._0_4_ = 0;
  pCnf = (Cnf_Dat_t *)0x0;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  puVar10 = (uint *)Vec_IntArray(vInv);
  nSize = *puVar10;
  p_01 = Vec_IntAlloc(100);
  p_02 = Vec_BitStart(nSize);
  iVar8 = p_00->nVars;
  iVar3 = Gia_ManRegNum(p);
  iVar4 = Gia_ManPoNum(p);
  iVar5 = sat_solver_nvars(s);
  iVar6 = sat_solver_nvars(s);
  if (iVar6 != p_00->nVars) {
    __assert_fail("sat_solver_nvars(pSat) == pCnf->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                  ,0x333,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
  }
  iVar6 = sat_solver_nvars(s);
  sat_solver_setnvars(s,iVar6 + nSize);
  pList = (int *)(puVar10 + 1);
  for (status = 0; status < (int)*puVar10; status = status + 1) {
    iVar6 = Abc_Var2Lit(iVar5 + status,1);
    Vec_IntFill(p_01,1,iVar6);
    for (nLits = 0; nLits < *pList; nLits = nLits + 1) {
      iVar6 = Abc_Lit2Var(pList[nLits + 1]);
      iVar7 = Abc_LitIsCompl(pList[nLits + 1]);
      iVar6 = Abc_Var2Lit((iVar8 - iVar3) + iVar6,(uint)((iVar7 != 0 ^ 0xffU) & 1));
      Vec_IntPush(p_01,iVar6);
    }
    piVar11 = Vec_IntArray(p_01);
    piVar12 = Vec_IntLimit(p_01);
    iVar6 = sat_solver_addclause(s,piVar11,piVar12);
    if (iVar6 != 1) {
      __assert_fail("status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                    ,0x33e,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
    }
    pList = pList + (*pList + 1);
  }
  for (status = 0; status < (int)*puVar10; status = status + 1) {
    iVar8 = Vec_BitEntry(p_02,status);
    if (iVar8 == 0) {
      Vec_IntClear(p_01);
      for (nLits = 0; nLits < (int)nSize; nLits = nLits + 1) {
        if ((nLits != status) && (iVar8 = Vec_BitEntry(p_02,nLits), iVar8 == 0)) {
          iVar8 = Abc_Var2Lit(iVar5 + nLits,0);
          Vec_IntPush(p_01,iVar8);
        }
      }
      iVar8 = Vec_IntSize(p_01);
      for (nLits = 0; iVar3 = Gia_ManPoNum(p), nLits < iVar3; nLits = nLits + 1) {
        Vec_IntShrink(p_01,iVar8);
        iVar3 = Abc_Var2Lit(nLits + 1,0);
        Vec_IntPush(p_01,iVar3);
        piVar11 = Vec_IntArray(p_01);
        piVar12 = Vec_IntLimit(p_01);
        iVar3 = sat_solver_solve(s,piVar11,piVar12,0,0,0,0);
        if (iVar3 == 0) {
          bVar1 = true;
          break;
        }
        if (iVar3 == 1) break;
        if (iVar3 != -1) {
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                        ,0x35a,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
        }
      }
      if (bVar1) break;
      iVar3 = Gia_ManPoNum(p);
      if (iVar3 <= nLits) {
        bVar2 = false;
        pList = (int *)(puVar10 + 1);
        for (k = 0; k < (int)*puVar10; k = k + 1) {
          iVar3 = Vec_BitEntry(p_02,k);
          if ((iVar3 == 0) && (k != status)) {
            Vec_IntShrink(p_01,iVar8);
            for (nLits = 0; nLits < *pList; nLits = nLits + 1) {
              iVar3 = Abc_Lit2Var(pList[nLits + 1]);
              iVar6 = Abc_LitIsCompl(pList[nLits + 1]);
              iVar3 = Abc_Var2Lit(iVar4 + 1 + iVar3,iVar6);
              Vec_IntPush(p_01,iVar3);
            }
            piVar11 = Vec_IntArray(p_01);
            piVar12 = Vec_IntLimit(p_01);
            iVar3 = sat_solver_solve(s,piVar11,piVar12,0,0,0,0);
            if (iVar3 == 0) {
              bVar1 = true;
              break;
            }
            if (iVar3 != -1) {
              if (iVar3 != 1) {
                __assert_fail("status == l_True",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                              ,0x375,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
              }
              bVar2 = true;
              break;
            }
          }
          pList = pList + (*pList + 1);
        }
        if (bVar1) break;
        if (!bVar2) {
          if (fVerbose != 0) {
            Abc_Print(1,"Removing clause %d.\n",(ulong)(uint)status);
          }
          Vec_BitWriteEntry(p_02,status,1);
          vRes._0_4_ = (uint)vRes + 1;
        }
      }
    }
  }
  if ((uint)vRes == 0) {
    Abc_Print(1,"Invariant minimization did not change the invariant.  ");
  }
  else {
    Abc_Print(1,"Invariant minimization reduced %d clauses (out of %d).  ",(ulong)(uint)vRes,
              (ulong)nSize);
  }
  aVar13 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar13 - aVar9);
  if ((!bVar1) && (0 < (int)(uint)vRes)) {
    pCnf = (Cnf_Dat_t *)Vec_IntAlloc(1000);
    Vec_IntPush((Vec_Int_t *)pCnf,nSize - (uint)vRes);
    pList = (int *)(puVar10 + 1);
    for (status = 0; status < (int)*puVar10; status = status + 1) {
      iVar8 = Vec_BitEntry(p_02,status);
      if (iVar8 == 0) {
        for (nLits = 0; nLits <= *pList; nLits = nLits + 1) {
          Vec_IntPush((Vec_Int_t *)pCnf,pList[nLits]);
        }
      }
      pList = pList + (*pList + 1);
    }
    iVar8 = Vec_IntEntryLast(vInv);
    Vec_IntPush((Vec_Int_t *)pCnf,iVar8);
  }
  Cnf_DataFree(p_00);
  sat_solver_delete(s);
  Vec_BitFree(p_02);
  Vec_IntFree(p_01);
  return (Vec_Int_t *)pCnf;
}

Assistant:

Vec_Int_t * Pdr_InvMinimize( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose )
{
    int nBTLimit = 0;
    int fCheckProperty = 1;
    abctime clk = Abc_Clock();
    int n, i, k, status, nLits, fFailed = 0, fCannot = 0, nRemoved = 0; 
    Vec_Int_t * vRes = NULL;
    // create SAT solver
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    int * pCube, * pList = Vec_IntArray(vInv), nCubes = pList[0];
    // create variables
    Vec_Int_t * vLits = Vec_IntAlloc(100);
    Vec_Bit_t * vRemoved = Vec_BitStart( nCubes );
    int iFoVarBeg = pCnf->nVars - Gia_ManRegNum(p);
    int iFiVarBeg = 1 + Gia_ManPoNum(p);
    int iAuxVarBeg = sat_solver_nvars(pSat);
    // allocate auxiliary variables
    assert( sat_solver_nvars(pSat) == pCnf->nVars );
    sat_solver_setnvars( pSat, sat_solver_nvars(pSat) + nCubes );
    // add clauses
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect literals
        Vec_IntFill( vLits, 1, Abc_Var2Lit(iAuxVarBeg + i, 1) ); // neg aux literal
        for ( k = 0; k < pCube[0]; k++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iFoVarBeg + Abc_Lit2Var(pCube[k+1]), !Abc_LitIsCompl(pCube[k+1])) );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // iterate through clauses 
    Pdr_ForEachCube( pList, pCube, i )
    {
        if ( Vec_BitEntry(vRemoved, i) )
            continue;
        // collect aux literals for remaining clauses
        Vec_IntClear( vLits );
        for ( k = 0; k < nCubes; k++ )
            if ( k != i && !Vec_BitEntry(vRemoved, k) ) // skip this cube and already removed cubes
                Vec_IntPush( vLits, Abc_Var2Lit(iAuxVarBeg + k, 0) ); // pos aux literal
        nLits = Vec_IntSize( vLits );
        // check if the property still holds
        if ( fCheckProperty )
        {
            for ( k = 0; k < Gia_ManPoNum(p); k++ )
            {
                Vec_IntShrink( vLits, nLits );
                Vec_IntPush( vLits, Abc_Var2Lit(1+k, 0) );
                status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
                if ( status == l_Undef ) // timeout
                {
                    fFailed = 1;
                    break;
                }
                if ( status == l_True ) // sat - property fails
                    break;
                assert( status == l_False ); // unsat - property holds
            }
            if ( fFailed )
                break;
            if ( k < Gia_ManPoNum(p) )
                continue;
        }
        // check other clauses
        fCannot = 0;
        Pdr_ForEachCube( pList, pCube, n )
        {
            if ( Vec_BitEntry(vRemoved, n) || n == i )
                continue;
            // collect cube
            Vec_IntShrink( vLits, nLits );
            for ( k = 0; k < pCube[0]; k++ )
               Vec_IntPush( vLits, Abc_Var2Lit(iFiVarBeg + Abc_Lit2Var(pCube[k+1]), Abc_LitIsCompl(pCube[k+1])) );
            // check if this cube intersects with the complement of other cubes in the solver
            // if it does not intersect, then it is redundant and can be skipped
            status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef ) // timeout
            {
                fFailed = 1;
                break;
            }
            if ( status == l_False ) // unsat -- correct
                continue;
            assert( status == l_True );
            // cannot remove
            fCannot = 1;
            break;
        }
        if ( fFailed )
            break;
        if ( fCannot )
            continue;
        if ( fVerbose )
        Abc_Print(1, "Removing clause %d.\n", i );
        Vec_BitWriteEntry( vRemoved, i, 1 );
        nRemoved++;
    }
    if ( nRemoved )
        Abc_Print(1, "Invariant minimization reduced %d clauses (out of %d).  ", nRemoved, nCubes );
    else
        Abc_Print(1, "Invariant minimization did not change the invariant.  " ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // cleanup cover
    if ( !fFailed && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, nCubes-nRemoved );
        Pdr_ForEachCube( pList, pCube, i )
            if ( !Vec_BitEntry(vRemoved, i) )
                for ( k = 0; k <= pCube[0]; k++ )
                    Vec_IntPush( vRes, pCube[k] );
        Vec_IntPush( vRes, Vec_IntEntryLast(vInv) );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_BitFree( vRemoved );
    Vec_IntFree( vLits );
    return vRes;
}